

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostzposix.c
# Opt level: O0

int os_get_timezone_info(os_tzinfo_t *info)

{
  int iVar1;
  char *__s;
  char *src;
  tm *ptVar2;
  char *in_RDI;
  tm *tm;
  time_t timer;
  char *tz;
  int in_stack_00000034;
  size_t in_stack_00000038;
  char *in_stack_00000040;
  os_tzinfo_t *in_stack_00000048;
  int local_4;
  
  __s = getenv("TZ");
  if (__s != (char *)0x0) {
    strlen(__s);
    iVar1 = oss_parse_posix_tz(in_stack_00000048,in_stack_00000040,in_stack_00000038,
                               in_stack_00000034);
    if (iVar1 != 0) {
      return 1;
    }
  }
  src = (char *)time((time_t *)0x0);
  ptVar2 = localtime((time_t *)&stack0xffffffffffffffe0);
  if (ptVar2 == (tm *)0x0) {
    local_4 = 0;
  }
  else {
    memset(in_RDI,0,0x5c);
    *(int *)(in_RDI + 0x58) = ptVar2->tm_isdst;
    if (ptVar2->tm_isdst == 0) {
      *(int *)in_RDI = (int)ptVar2->tm_gmtoff;
      safe_strcpy(in_RDI,(size_t)__s,src);
    }
    else {
      *(int *)(in_RDI + 4) = (int)ptVar2->tm_gmtoff;
      safe_strcpy(in_RDI,(size_t)__s,src);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
os_get_timezone_info( struct os_tzinfo_t *info )
{
    /* try parsing environment variable TZ as a POSIX timezone string */
    const char *tz = getenv("TZ");
    if (tz != 0 && oss_parse_posix_tz(info, tz, strlen(tz), TRUE))
        return TRUE;

    /* fall back on localtime() - that'll at least give us the current
     * timezone name and GMT offset in most cases
     */
    time_t timer = time(0);
    const struct tm *tm = localtime(&timer);
    if (tm != 0)
    {
        memset(info, 0, sizeof(*info));
        info->is_dst = tm->tm_isdst;
        if (tm->tm_isdst)
        {
            info->dst_ofs = tm->tm_gmtoff;
            safe_strcpy(info->dst_abbr, sizeof(info->dst_abbr), tm->tm_zone);
        }
        else
        {
            info->std_ofs = tm->tm_gmtoff;
            safe_strcpy(info->std_abbr, sizeof(info->std_abbr), tm->tm_zone);
        }
        return TRUE;
    }

    /* no information is available */
    return FALSE;
}